

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

string * __thiscall
libtorrent::lexically_relative_abi_cxx11_
          (string *__return_storage_ptr__,libtorrent *this,string_view base,string_view target)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  int iVar2;
  difference_type dVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  char *__first;
  aux *paVar7;
  aux *this_00;
  string_view last;
  string_view last_00;
  string_view target_local;
  undefined1 local_68 [16];
  aux *local_58;
  char *pcStack_50;
  string_view prev_target;
  
  pcVar6 = (char *)target._M_len;
  target_local._M_len = (size_t)base._M_str;
  pcVar4 = (char *)base._M_len;
  if (this == (libtorrent *)0x0) {
    paVar7 = (aux *)0x0;
  }
  else {
    paVar7 = (aux *)(this + -(ulong)((pcVar4 + -1)[(long)this] == '/'));
  }
  target_local._M_str = pcVar6;
  if (((char *)target_local._M_len != (char *)0x0) && ((pcVar6 + -1)[target_local._M_len] == '/')) {
    target_local._M_len = target_local._M_len + -1;
  }
  do {
    this_00 = paVar7;
    __first = pcVar4;
    if (this_00 == (aux *)0x0) goto LAB_0021dcd2;
    prev_target._M_len = target_local._M_len;
    prev_target._M_str = target_local._M_str;
    last._M_str = (char *)0x2f;
    last._M_len = (size_t)__first;
    aux::split_string((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       *)local_68,this_00,last,(char)pcVar6);
    pcVar4 = pcStack_50;
    paVar7 = local_58;
    __x._1_15_ = local_68._1_15_;
    __x._M_len._0_1_ = local_68[0];
    last_00._M_str = (char *)0x2f;
    last_00._M_len = (size_t)target_local._M_str;
    aux::split_string((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       *)local_68,(aux *)target_local._M_len,last_00,(char)pcVar6);
    __y._1_15_ = local_68._1_15_;
    __y._M_len._0_1_ = local_68[0];
    target_local._M_len = (size_t)local_58;
    target_local._M_str = pcStack_50;
    bVar1 = ::std::operator==(__x,__y);
  } while (bVar1);
  target_local._M_len = prev_target._M_len;
  target_local._M_str = prev_target._M_str;
LAB_0021dcd2:
  local_68[0] = 0x2f;
  dVar3 = ::std::__count_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (__first,__first + (long)this_00,(_Iter_equals_val<const_char>)local_68);
  iVar2 = ((int)dVar3 + 1) - (uint)(this_00 == (aux *)0x0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar5 = 0;
  if (0 < iVar2) {
    iVar5 = iVar2;
  }
  while (iVar5 != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    iVar5 = iVar5 + -1;
  }
  ::std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)__return_storage_ptr__,&target_local);
  return __return_storage_ptr__;
}

Assistant:

std::string lexically_relative(string_view base, string_view target)
	{
		// first, strip trailing directory separators
		if (!base.empty() && base.back() == TORRENT_SEPARATOR_CHAR)
			base.remove_suffix(1);
		if (!target.empty() && target.back() == TORRENT_SEPARATOR_CHAR)
			target.remove_suffix(1);

		// strip common path elements
		for (;;)
		{
			if (base.empty()) break;
			string_view prev_base = base;
			string_view prev_target = target;

			string_view base_element;
			string_view target_element;
			std::tie(base_element, base) = aux::split_string(base, TORRENT_SEPARATOR_CHAR);
			std::tie(target_element, target) = aux::split_string(target, TORRENT_SEPARATOR_CHAR);
			if (base_element == target_element) continue;

			base = prev_base;
			target = prev_target;
			break;
		}

		// count number of path elements left in base, and prepend that number of
		// "../" to target

		// base always points to a directory. There's an implied directory
		// separator at the end of it
		int const num_steps = static_cast<int>(std::count(
			base.begin(), base.end(), TORRENT_SEPARATOR_CHAR)) + (base.empty() ? 0 : 1);
		std::string ret;
		for (int i = 0; i < num_steps; ++i)
			ret += ".." TORRENT_SEPARATOR;

		ret += target;
		return ret;
	}